

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsslserver.cpp
# Opt level: O0

void QSslServer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QMetaType QVar2;
  QtMocHelpers *in_RCX;
  AlertType in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QSslServer *_t;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  SocketError in_stack_fffffffffffffea4;
  QSslServer *in_stack_fffffffffffffea8;
  QSslSocket *in_stack_fffffffffffffeb8;
  QMetaType local_a0;
  QMetaTypeInterface *local_98;
  QMetaType local_90;
  QMetaTypeInterface *local_88;
  QMetaType local_80;
  QMetaTypeInterface *local_78;
  QMetaType local_70;
  QMetaTypeInterface *local_68;
  QMetaTypeInterface *local_60;
  QMetaType local_58;
  QMetaTypeInterface *local_50;
  QMetaTypeInterface *local_48;
  QMetaType local_40;
  QMetaTypeInterface *local_38;
  QMetaType local_30;
  QMetaTypeInterface *local_28;
  QMetaTypeInterface *local_20;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case CloseNotify:
      sslErrors((QSslServer *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                (QSslSocket *)in_stack_fffffffffffffea8,
                (QList<QSslError> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      break;
    case 1:
      peerVerifyError((QSslServer *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                      (QSslSocket *)in_stack_fffffffffffffea8,
                      (QSslError *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      break;
    case 2:
      errorOccurred((QSslServer *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                    (QSslSocket *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      break;
    case 3:
      preSharedKeyAuthenticationRequired
                ((QSslServer *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (QSslSocket *)in_stack_fffffffffffffea8,
                 (QSslPreSharedKeyAuthenticator *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      break;
    case 4:
      alertSent(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb8,Warning,in_EDX,
                (QString *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      break;
    case 5:
      alertReceived(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb8,Warning,in_EDX,
                    (QString *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      break;
    case 6:
      handshakeInterruptedOnError
                ((QSslServer *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (QSslSocket *)in_stack_fffffffffffffea8,
                 (QSslError *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      break;
    case 7:
      startedEncryptionHandshake
                ((QSslServer *)0x3b1d62,
                 (QSslSocket *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
  }
  if (in_ESI == 7) {
    switch(in_EDX) {
    case CloseNotify:
      if (**(int **)(in_RCX + 8) == 0) {
        local_28 = (QMetaTypeInterface *)QMetaType::fromType<QSslSocket*>();
        **(undefined8 **)in_RCX = local_28;
      }
      else if (**(int **)(in_RCX + 8) == 1) {
        local_20 = (QMetaTypeInterface *)QMetaType::fromType<QList<QSslError>>();
        **(undefined8 **)in_RCX = local_20;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
      break;
    case 1:
      if (**(int **)(in_RCX + 8) == 0) {
        local_38 = (QMetaTypeInterface *)QMetaType::fromType<QSslSocket*>();
        **(undefined8 **)in_RCX = local_38;
      }
      else {
        memset(&local_30,0,8);
        QMetaType::QMetaType(&local_30);
        **(undefined8 **)in_RCX = local_30.d_ptr;
      }
      break;
    case 2:
      if (**(int **)(in_RCX + 8) == 0) {
        local_50 = (QMetaTypeInterface *)QMetaType::fromType<QSslSocket*>();
        **(undefined8 **)in_RCX = local_50;
      }
      else if (**(int **)(in_RCX + 8) == 1) {
        local_48 = (QMetaTypeInterface *)QMetaType::fromType<QAbstractSocket::SocketError>();
        **(undefined8 **)in_RCX = local_48;
      }
      else {
        memset(&local_40,0,8);
        QMetaType::QMetaType(&local_40);
        **(undefined8 **)in_RCX = local_40.d_ptr;
      }
      break;
    case 3:
      if (**(int **)(in_RCX + 8) == 0) {
        local_68 = (QMetaTypeInterface *)QMetaType::fromType<QSslSocket*>();
        **(undefined8 **)in_RCX = local_68;
      }
      else if (**(int **)(in_RCX + 8) == 1) {
        local_60 = (QMetaTypeInterface *)QMetaType::fromType<QSslPreSharedKeyAuthenticator*>();
        **(undefined8 **)in_RCX = local_60;
      }
      else {
        memset(&local_58,0,8);
        QMetaType::QMetaType(&local_58);
        **(undefined8 **)in_RCX = local_58.d_ptr;
      }
      break;
    case 4:
      if (**(int **)(in_RCX + 8) == 0) {
        local_78 = (QMetaTypeInterface *)QMetaType::fromType<QSslSocket*>();
        **(undefined8 **)in_RCX = local_78;
      }
      else {
        memset(&local_70,0,8);
        QMetaType::QMetaType(&local_70);
        **(undefined8 **)in_RCX = local_70.d_ptr;
      }
      break;
    case 5:
      if (**(int **)(in_RCX + 8) == 0) {
        local_88 = (QMetaTypeInterface *)QMetaType::fromType<QSslSocket*>();
        **(undefined8 **)in_RCX = local_88;
      }
      else {
        memset(&local_80,0,8);
        QMetaType::QMetaType(&local_80);
        **(undefined8 **)in_RCX = local_80.d_ptr;
      }
      break;
    case 6:
      if (**(int **)(in_RCX + 8) == 0) {
        local_98 = (QMetaTypeInterface *)QMetaType::fromType<QSslSocket*>();
        **(undefined8 **)in_RCX = local_98;
      }
      else {
        memset(&local_90,0,8);
        QMetaType::QMetaType(&local_90);
        **(undefined8 **)in_RCX = local_90.d_ptr;
      }
      break;
    case 7:
      if (**(int **)(in_RCX + 8) == 0) {
        QVar2 = QMetaType::fromType<QSslSocket*>();
        **(undefined8 **)in_RCX = QVar2.d_ptr;
      }
      else {
        memset(&local_a0,0,8);
        QMetaType::QMetaType(&local_a0);
        **(undefined8 **)in_RCX = local_a0.d_ptr;
      }
      break;
    default:
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
    }
  }
  if (((((in_ESI == 5) &&
        (bVar1 = QtMocHelpers::
                 indexOfMethod<void(QSslServer::*)(QSslSocket*,QList<QSslError>const&)>
                           (in_RCX,(void **)sslErrors,0,0), !bVar1)) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QSslServer::*)(QSslSocket*,QSslError_const&)>
                          (in_RCX,(void **)peerVerifyError,0,1), !bVar1)) &&
      ((bVar1 = QtMocHelpers::
                indexOfMethod<void(QSslServer::*)(QSslSocket*,QAbstractSocket::SocketError)>
                          (in_RCX,(void **)errorOccurred,0,2), !bVar1 &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QSslServer::*)(QSslSocket*,QSslPreSharedKeyAuthenticator*)>
                          (in_RCX,(void **)preSharedKeyAuthenticationRequired,0,3), !bVar1)))) &&
     ((bVar1 = QtMocHelpers::
               indexOfMethod<void(QSslServer::*)(QSslSocket*,QSsl::AlertLevel,QSsl::AlertType,QString_const&)>
                         (in_RCX,(void **)alertSent,0,4), !bVar1 &&
      ((bVar1 = QtMocHelpers::
                indexOfMethod<void(QSslServer::*)(QSslSocket*,QSsl::AlertLevel,QSsl::AlertType,QString_const&)>
                          (in_RCX,(void **)alertReceived,0,5), !bVar1 &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QSslServer::*)(QSslSocket*,QSslError_const&)>
                          (in_RCX,(void **)handshakeInterruptedOnError,0,6), !bVar1)))))) {
    QtMocHelpers::indexOfMethod<void(QSslServer::*)(QSslSocket*)>
              (in_RCX,(void **)startedEncryptionHandshake,0,7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslServer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSslServer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[2]))); break;
        case 1: _t->peerVerifyError((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[2]))); break;
        case 2: _t->errorOccurred((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[2]))); break;
        case 3: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[2]))); break;
        case 4: _t->alertSent((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[4]))); break;
        case 5: _t->alertReceived((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[4]))); break;
        case 6: _t->handshakeInterruptedOnError((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[2]))); break;
        case 7: _t->startedEncryptionHandshake((*reinterpret_cast< std::add_pointer_t<QSslSocket*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslSocket* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , const QList<QSslError> & )>(_a, &QSslServer::sslErrors, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , const QSslError & )>(_a, &QSslServer::peerVerifyError, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QAbstractSocket::SocketError )>(_a, &QSslServer::errorOccurred, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QSslPreSharedKeyAuthenticator * )>(_a, &QSslServer::preSharedKeyAuthenticationRequired, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslServer::alertSent, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslServer::alertReceived, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * , const QSslError & )>(_a, &QSslServer::handshakeInterruptedOnError, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslServer::*)(QSslSocket * )>(_a, &QSslServer::startedEncryptionHandshake, 7))
            return;
    }
}